

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ggwave_ProtocolId gVar6;
  ggwave_Parameters *pgVar7;
  long *plVar8;
  void *pvVar9;
  Protocols *pPVar10;
  undefined8 *puVar11;
  _Rb_tree_node_base *p_Var12;
  undefined8 extraout_RAX;
  ulong uVar13;
  Protocol *pPVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  string payload_1;
  TxRxData result;
  string payload;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  GGWave instance;
  float local_670;
  ggwave_Parameters local_668;
  _Base_ptr local_640;
  long local_638;
  undefined4 local_630;
  undefined1 *local_628;
  uint local_620;
  undefined1 local_618 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_608;
  Protocol *local_5f0;
  GGWave local_5e8 [1464];
  
  bVar18 = true;
  if (1 < argc) {
    iVar3 = strcmp(argv[1],"--full");
    bVar18 = iVar3 != 0;
  }
  local_608.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_608.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_608.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pgVar7 = (ggwave_Parameters *)GGWave::getDefaultParameters();
  GGWave::GGWave(local_5e8,pgVar7);
  local_668._0_8_ = &local_668.samplesPerFrame;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_668,"hello","");
  cVar2 = GGWave::init((char *)local_5e8,local_668.payloadLength,1);
  if (cVar2 == '\0') goto LAB_00104416;
  cVar2 = GGWave::init((int)local_5e8,(char *)0xffffffff,0x1081bf,1);
  if (cVar2 != '\0') goto LAB_0010441b;
  cVar2 = GGWave::init((int)local_5e8,(char *)0x0,GGWAVE_PROTOCOL_AUDIBLE_NORMAL,1);
  if (cVar2 == '\0') goto LAB_00104420;
  cVar2 = GGWave::init((int)local_5e8,(char *)0x0,0x1081bf,1);
  if (cVar2 == '\0') goto LAB_00104425;
  cVar2 = GGWave::init((int)local_5e8,(char *)0x1,0x1081bf,1);
  if (cVar2 == '\0') goto LAB_0010442a;
  cVar2 = GGWave::init((int)local_5e8,(char *)0x2,0x1081bf,1);
  if (cVar2 == '\0') goto LAB_0010442f;
  cVar2 = GGWave::init((int)local_5e8,(char *)0x3,0x1081bf,1);
  if (cVar2 == '\0') goto LAB_00104434;
  cVar2 = GGWave::init((int)local_5e8,(char *)(local_668._8_8_ & 0xffffffff),local_668.payloadLength
                       ,1);
  if (cVar2 != '\0') goto LAB_00104439;
  cVar2 = GGWave::init((int)local_5e8,(char *)(local_668._8_8_ & 0xffffffff),local_668.payloadLength
                       ,1);
  if (cVar2 == '\0') goto LAB_0010443e;
  cVar2 = GGWave::init((int)local_5e8,(char *)(local_668._8_8_ & 0xffffffff),local_668.payloadLength
                       ,1);
  if (cVar2 == '\0') goto LAB_00104443;
  cVar2 = GGWave::init((int)local_5e8,(char *)(local_668._8_8_ & 0xffffffff),local_668.payloadLength
                       ,1);
  if (cVar2 != '\0') {
    cVar2 = GGWave::init((int)local_5e8,(char *)(local_668._8_8_ & 0xffffffff),
                         local_668.payloadLength,1);
    if (cVar2 != '\0') goto LAB_0010444d;
    if ((int *)local_668._0_8_ != &local_668.samplesPerFrame) {
      operator_delete((void *)local_668._0_8_);
    }
    GGWave::~GGWave(local_5e8);
    uVar17 = 8000;
    local_670 = 8000.0;
    while( true ) {
      uVar16 = (uint)uVar17;
      printf("Testing: sample rate = %d\n",uVar17);
      plVar8 = (long *)GGWave::getDefaultParameters();
      local_668._0_8_ = *plVar8;
      local_668.sampleRateOut = *(float *)(plVar8 + 1);
      local_668.sampleRate = *(float *)((long)plVar8 + 0xc);
      local_668._24_8_ = plVar8[3];
      local_668.operatingMode = *(int *)(plVar8 + 4);
      local_668.soundMarkerThreshold = 3.0;
      local_668.samplesPerFrame = (int)plVar8[2];
      local_628 = local_618;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"hello123","");
      local_668.sampleRateOut = local_670;
      GGWave::GGWave(local_5e8,&local_668);
      GGWave::init((char *)local_5e8,(ggwave_ProtocolId)local_628,8);
      uVar4 = GGWave::encodeSize_bytes();
      uVar5 = GGWave::encode();
      printf("Expected = %d, actual = %d\n",(ulong)uVar4,(ulong)uVar5);
      if (uVar4 < uVar5) break;
      pvVar9 = (void *)GGWave::txWaveform();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_608,(ulong)uVar5);
      memcpy(local_608.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,pvVar9,(ulong)uVar5);
      main::anon_class_8_1_4eff857e::operator()
                ((anon_class_8_1_4eff857e *)&local_608,0.01,local_668.sampleFormatOut);
      main::anon_class_8_1_4eff857e::operator()
                ((anon_class_8_1_4eff857e *)&local_608,local_668.sampleFormatOut,
                 local_668.sampleFormatInp);
      GGWave::~GGWave(local_5e8);
      local_668.sampleRateInp = local_670;
      GGWave::GGWave(local_5e8,&local_668);
      gVar6 = GGWave::rxProtocols();
      GGWave::Protocols::only(gVar6);
      GGWave::decode(local_5e8,
                     (uint)local_608.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
      local_638 = 0;
      local_630 = 0;
      uVar4 = GGWave::rxTakeData((ggvector *)local_5e8);
      if (uVar4 != local_620) goto LAB_00104411;
      if (0 < (int)uVar4) {
        uVar17 = 0;
        do {
          if ((int)(char)local_628[uVar17] != (uint)*(byte *)(local_638 + uVar17))
          goto LAB_00104407;
          uVar17 = uVar17 + 1;
        } while (uVar4 != uVar17);
      }
      GGWave::~GGWave(local_5e8);
      if (local_628 != local_618) {
        operator_delete(local_628);
      }
      uVar4 = uVar16 + 0x55b;
      local_670 = (float)(int)uVar4;
      uVar17 = (ulong)uVar4;
      if (0x171a5 < uVar16) {
        local_628 = local_618;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"a0Z5kR2g","");
        local_640 = kFormats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if ((_Rb_tree_header *)kFormats._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
            &kFormats._M_t._M_impl.super__Rb_tree_header) {
          p_Var12 = kFormats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            for (; (_Rb_tree_header *)p_Var12 != &kFormats._M_t._M_impl.super__Rb_tree_header;
                p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
              if ((!bVar18) || ((local_640[1]._M_color == 4 && (p_Var12[1]._M_color == 5)))) {
                lVar15 = 0;
                do {
                  pPVar10 = GGWave::Protocols::kDefault();
                  if (pPVar10->data[lVar15].enabled != false) {
                    pPVar14 = pPVar10->data + lVar15;
                    printf("Testing: protocol = %s, in = %d, out = %d\n",pPVar14->name,
                           (ulong)p_Var12[1]._M_color,(ulong)local_640[1]._M_color);
                    iVar3 = (int)local_5e8;
                    if ((0 < (int)local_620) && (pPVar14->extra != '\x02')) {
                      uVar17 = 1;
                      local_5f0 = pPVar14;
                      do {
                        plVar8 = (long *)GGWave::getDefaultParameters();
                        local_668.operatingMode = *(int *)(plVar8 + 4);
                        local_668._0_8_ = *plVar8;
                        local_668._8_8_ = plVar8[1];
                        local_668._16_8_ = plVar8[2];
                        local_668.sampleFormatOut = local_640[1]._M_color;
                        local_668.sampleFormatInp = p_Var12[1]._M_color;
                        GGWave::GGWave(local_5e8,&local_668);
                        gVar6 = GGWave::rxProtocols();
                        GGWave::Protocols::only(gVar6);
                        GGWave::init(iVar3,(char *)(uVar17 & 0xffffffff),
                                     (ggwave_ProtocolId)local_628,(int)lVar15);
                        uVar4 = GGWave::encodeSize_bytes();
                        uVar5 = GGWave::encode();
                        printf("Expected = %d, actual = %d\n",(ulong)uVar4,(ulong)uVar5);
                        if (uVar4 != uVar5) goto LAB_00104402;
                        pvVar9 = (void *)GGWave::txWaveform();
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_608,(ulong)uVar4);
                        memcpy(local_608.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,pvVar9,(ulong)uVar4);
                        main::anon_class_8_1_4eff857e::operator()
                                  ((anon_class_8_1_4eff857e *)&local_608,0.02,
                                   local_668.sampleFormatOut);
                        main::anon_class_8_1_4eff857e::operator()
                                  ((anon_class_8_1_4eff857e *)&local_608,local_640[1]._M_color,
                                   p_Var12[1]._M_color);
                        GGWave::decode(local_5e8,
                                       (uint)local_608.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                        local_638 = 0;
                        local_630 = 0;
                        uVar4 = GGWave::rxTakeData((ggvector *)local_5e8);
                        if (uVar17 != uVar4) goto LAB_001043fd;
                        uVar13 = 0;
                        do {
                          if ((int)(char)local_628[uVar13] != (uint)*(byte *)(local_638 + uVar13))
                          goto LAB_001043ee;
                          uVar13 = uVar13 + 1;
                        } while (uVar17 != uVar13);
                        GGWave::~GGWave(local_5e8);
                      } while (((long)uVar17 < (long)(int)local_620) &&
                              (uVar17 = uVar17 + 1, local_5f0->extra != '\x02'));
                    }
                    if (0 < (int)local_620) {
                      uVar17 = 1;
                      do {
                        puVar11 = (undefined8 *)GGWave::getDefaultParameters();
                        local_668._8_8_ = puVar11[1];
                        local_668._16_8_ = puVar11[2];
                        local_668.operatingMode = *(int *)(puVar11 + 4);
                        local_668.sampleRateInp = (float)((ulong)*puVar11 >> 0x20);
                        local_668.payloadLength = (int)uVar17;
                        local_668.sampleFormatOut = local_640[1]._M_color;
                        local_668.sampleFormatInp = p_Var12[1]._M_color;
                        uVar4 = rand();
                        if ((uVar4 & 1) == 0) {
                          local_668.operatingMode = local_668.operatingMode | 0x10;
                        }
                        GGWave::GGWave(local_5e8,&local_668);
                        gVar6 = GGWave::rxProtocols();
                        GGWave::Protocols::only(gVar6);
                        GGWave::init(iVar3,(char *)(uVar17 & 0xffffffff),
                                     (ggwave_ProtocolId)local_628,(int)lVar15);
                        uVar4 = GGWave::encodeSize_bytes();
                        uVar5 = GGWave::encode();
                        printf("Expected = %d, actual = %d\n",(ulong)uVar4,(ulong)uVar5);
                        if (uVar4 != uVar5) goto LAB_001043f3;
                        pvVar9 = (void *)GGWave::txWaveform();
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                  (&local_608,(ulong)uVar4);
                        memcpy(local_608.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,pvVar9,(ulong)uVar4);
                        main::anon_class_8_1_4eff857e::operator()
                                  ((anon_class_8_1_4eff857e *)&local_608,0.1,
                                   local_668.sampleFormatOut);
                        main::anon_class_8_1_4eff857e::operator()
                                  ((anon_class_8_1_4eff857e *)&local_608,local_640[1]._M_color,
                                   p_Var12[1]._M_color);
                        GGWave::decode(local_5e8,
                                       (uint)local_608.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                        local_638 = 0;
                        local_630 = 0;
                        uVar4 = GGWave::rxTakeData((ggvector *)local_5e8);
                        if (uVar17 != uVar4) goto LAB_001043f8;
                        uVar13 = 0;
                        do {
                          if ((int)(char)local_628[uVar13] != (uint)*(byte *)(local_638 + uVar13)) {
                            main_cold_17();
LAB_001043ee:
                            main_cold_14();
                            goto LAB_001043f3;
                          }
                          uVar13 = uVar13 + 1;
                        } while (uVar17 != uVar13);
                        GGWave::~GGWave(local_5e8);
                        bVar1 = (long)uVar17 < (long)(int)local_620;
                        uVar17 = uVar17 + 1;
                      } while (bVar1);
                    }
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 0x16);
              }
            }
            local_640 = (_Base_ptr)std::_Rb_tree_increment(local_640);
            p_Var12 = kFormats._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          } while ((_Rb_tree_header *)local_640 != &kFormats._M_t._M_impl.super__Rb_tree_header);
        }
        if (local_628 != local_618) {
          operator_delete(local_628);
        }
        if (local_608.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_608.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return 0;
      }
    }
    goto LAB_0010440c;
  }
  goto LAB_00104448;
LAB_001043f3:
  main_cold_15();
LAB_001043f8:
  main_cold_16();
LAB_001043fd:
  main_cold_13();
LAB_00104402:
  main_cold_12();
LAB_00104407:
  main_cold_11();
LAB_0010440c:
  main_cold_18();
LAB_00104411:
  main_cold_10();
LAB_00104416:
  main_cold_1();
LAB_0010441b:
  main_cold_21();
LAB_00104420:
  main_cold_2();
LAB_00104425:
  main_cold_3();
LAB_0010442a:
  main_cold_4();
LAB_0010442f:
  main_cold_5();
LAB_00104434:
  main_cold_6();
LAB_00104439:
  main_cold_20();
LAB_0010443e:
  main_cold_7();
LAB_00104443:
  main_cold_8();
LAB_00104448:
  main_cold_9();
LAB_0010444d:
  main_cold_19();
  if (local_608.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_608.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char ** argv) {
    bool full = false;
    if (argc > 1) {
        if (strcmp(argv[1], "--full") == 0) {
            full = true;
        }
    }

    std::vector<uint8_t> buffer;

    auto convertHelper = [&](GGWave::SampleFormat formatOut, GGWave::SampleFormat formatInp) {
        switch (formatOut) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
            case GGWAVE_SAMPLE_FORMAT_U8:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<uint8_t, int8_t>  (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<uint8_t, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<uint8_t, int16_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<uint8_t, float>   (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_I8:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<int8_t, uint8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<int8_t, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<int8_t, int16_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<int8_t, float>   (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_U16:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<uint16_t, uint8_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<uint16_t, int8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<uint16_t, int16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<uint16_t, float>  (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<int16_t, uint8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<int16_t, int8_t>  (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<int16_t, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<int16_t, float>   (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<float, uint8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<float, int8_t>  (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<float, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<float, int16_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       break;
                    };
                } break;
        };
    };

    auto addNoiseHelper = [&](float level, GGWave::SampleFormat format) {
        switch (format) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
            case GGWAVE_SAMPLE_FORMAT_U8:
                {
                    const int n = buffer.size()/sizeof(uint8_t);
                    auto p = (uint8_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(0.0f, std::min(255.0f, (float) p[i] + (frand() - 0.5f)*(level*256)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I8:
                {
                    const int n = buffer.size()/sizeof(int8_t);
                    auto p = (int8_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(-128.0f, std::min(127.0f, (float) p[i] + (frand() - 0.5f)*(level*256)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_U16:
                {
                    const int n = buffer.size()/sizeof(uint16_t);
                    auto p = (uint16_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(0.0f, std::min(65535.0f, (float) p[i] + (frand() - 0.5f)*(level*65536)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    const int n = buffer.size()/sizeof(int16_t);
                    auto p = (int16_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(-32768.0f, std::min(32767.0f, (float) p[i] + (frand() - 0.5f)*(level*65536)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32:
                {
                    const int n = buffer.size()/sizeof(float);
                    auto p = (float *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(-1.0f, std::min(1.0f, p[i] + (frand() - 0.5f)*(level)));
                    }
                } break;
        };
    };

    {
        GGWave instance(GGWave::getDefaultParameters());

        std::string payload = "hello";

        CHECK(instance.init(payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST));

        // data
        CHECK_F(instance.init(-1, "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(0,  nullptr, GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(0,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(1,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(2,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(3,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));

        // volume
        CHECK_F(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, -1));
        CHECK_T(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 0));
        CHECK_T(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 50));
        CHECK_T(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 100));
        CHECK_F(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 101));
    }

    // playback / capture at different sample rates
    for (int srInp = GGWave::kDefaultSampleRate/6; srInp <= 2*GGWave::kDefaultSampleRate; srInp += 1371) {
        printf("Testing: sample rate = %d\n", srInp);

        auto parameters = GGWave::getDefaultParameters();
        parameters.soundMarkerThreshold = 3.0f;

        const std::string payload = "hello123";

        // encode
        {
            parameters.sampleRateOut = srInp;
            GGWave instanceOut(parameters);

            instanceOut.init(payload.c_str(), GGWAVE_PROTOCOL_DT_FASTEST, 25);
            const auto expectedSize = instanceOut.encodeSize_bytes();
            const auto nBytes = instanceOut.encode();
            printf("Expected = %d, actual = %d\n", expectedSize, nBytes);
            CHECK(expectedSize >= nBytes);
            { auto p = (const uint8_t *)(instanceOut.txWaveform()); buffer.resize(nBytes); memcpy(buffer.data(), p, nBytes); }
            addNoiseHelper(0.01, parameters.sampleFormatOut); // add some artificial noise
            convertHelper(parameters.sampleFormatOut, parameters.sampleFormatInp);
        }

        // decode
        {
            parameters.sampleRateInp = srInp;
            GGWave instanceInp(parameters);
            instanceInp.rxProtocols().only(GGWAVE_PROTOCOL_DT_FASTEST);

            instanceInp.decode(buffer.data(), buffer.size());

            GGWave::TxRxData result;
            CHECK(instanceInp.rxTakeData(result) == (int) payload.size());
            for (int i = 0; i < (int) payload.size(); ++i) {
                CHECK(payload[i] == result[i]);
            }
        }
    }

    const std::string payload = "a0Z5kR2g";

    // encode / decode using different sample formats and Tx protocols
    for (const auto & formatOut : kFormats) {
        for (const auto & formatInp : kFormats) {
            if (full == false) {
                if (formatOut != GGWAVE_SAMPLE_FORMAT_I16) continue;
                if (formatInp != GGWAVE_SAMPLE_FORMAT_F32) continue;
            }
            for (int protocolId = 0; protocolId < GGWAVE_PROTOCOL_COUNT; ++protocolId) {
                const auto & protocol = GGWave::Protocols::kDefault()[protocolId];
                if (protocol.enabled == false) continue;
                printf("Testing: protocol = %s, in = %d, out = %d\n", protocol.name, formatInp, formatOut);

                for (int length = 1; length <= (int) payload.size(); ++length) {
                    // mono-tone protocols with variable length are not supported
                    if (protocol.extra == 2) {
                        break;
                    }

                    // variable payload length
                    {
                        auto parameters = GGWave::getDefaultParameters();
                        parameters.sampleFormatInp = formatInp;
                        parameters.sampleFormatOut = formatOut;
                        // it seems DSS is not suitable for "variable-length" transmission
                        // sometimes, the decoder incorrectly detects an early "end" marker when DSS is enabled
                        //if (rand() % 2 == 0) parameters.operatingMode |= GGWAVE_OPERATING_MODE_USE_DSS;
                        GGWave instance(parameters);
                        instance.rxProtocols().only(GGWave::ProtocolId(protocolId));

                        instance.init(length, payload.data(), GGWave::ProtocolId(protocolId), 25);
                        const auto expectedSize = instance.encodeSize_bytes();
                        const auto nBytes = instance.encode();
                        printf("Expected = %d, actual = %d\n", expectedSize, nBytes);
                        CHECK(expectedSize == nBytes);
                        { auto p = (const uint8_t *)(instance.txWaveform()); buffer.resize(nBytes); memcpy(buffer.data(), p, nBytes); }
                        addNoiseHelper(0.02, parameters.sampleFormatOut); // add some artificial noise
                        convertHelper(formatOut, formatInp);
                        instance.decode(buffer.data(), buffer.size());

                        GGWave::TxRxData result;
                        CHECK(instance.rxTakeData(result) == length);
                        for (int i = 0; i < length; ++i) {
                            CHECK(payload[i] == result[i]);
                        }
                    }
                }

                for (int length = 1; length <= (int) payload.size(); ++length) {
                    // fixed payload length
                    {
                        auto parameters = GGWave::getDefaultParameters();
                        parameters.payloadLength = length;
                        parameters.sampleFormatInp = formatInp;
                        parameters.sampleFormatOut = formatOut;
                        if (rand() % 2 == 0) parameters.operatingMode |= GGWAVE_OPERATING_MODE_USE_DSS;
                        GGWave instance(parameters);
                        instance.rxProtocols().only(GGWave::ProtocolId(protocolId));

                        instance.init(length, payload.data(), GGWave::ProtocolId(protocolId), 10);
                        const auto expectedSize = instance.encodeSize_bytes();
                        const auto nBytes = instance.encode();
                        printf("Expected = %d, actual = %d\n", expectedSize, nBytes);
                        CHECK(expectedSize == nBytes);
                        { auto p = (const uint8_t *)(instance.txWaveform()); buffer.resize(nBytes); memcpy(buffer.data(), p, nBytes); }
                        addNoiseHelper(0.10, parameters.sampleFormatOut); // add some artificial noise
                        convertHelper(formatOut, formatInp);
                        instance.decode(buffer.data(), buffer.size());

                        GGWave::TxRxData result;
                        CHECK(instance.rxTakeData(result) == length);
                        for (int i = 0; i < length; ++i) {
                            CHECK(payload[i] == result[i]);
                        }
                    }
                }
            }
        }
    }

    return 0;
}